

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

Key * __thiscall
QProcessEnvironmentPrivate::prepareName(QProcessEnvironmentPrivate *this,QString *name)

{
  long lVar1;
  bool bVar2;
  QString *this_00;
  QHash<QString,_QByteArray> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  Key *ent;
  NameMapMutexLocker locker;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffff78;
  QString *key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  NameMapMutexLocker::NameMapMutexLocker((NameMapMutexLocker *)in_RDI,in_stack_ffffffffffffff78);
  this_00 = (QString *)QHash<QString,_QByteArray>::operator[](in_RSI,key);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x794545);
  if (bVar2) {
    QString::toLocal8Bit(this_00);
    QByteArray::operator=((QByteArray *)in_RDI,(QByteArray *)in_stack_ffffffffffffff78);
    QByteArray::~QByteArray((QByteArray *)0x794575);
  }
  QByteArray::QByteArray((QByteArray *)in_RDI,(QByteArray *)in_stack_ffffffffffffff78);
  NameMapMutexLocker::~NameMapMutexLocker((NameMapMutexLocker *)0x7945ae);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Key *)key;
}

Assistant:

inline Key prepareName(const QString &name) const
    {
        const NameMapMutexLocker locker(this);
        Key &ent = nameMap[name];
        if (ent.isEmpty())
            ent = name.toLocal8Bit();
        return ent;
    }